

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_pgrsTimeWas(Curl_easy *data,timerid timer,curltime timestamp)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  timediff_t tVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  time_t tVar13;
  timediff_t *ptVar14;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  
  uVar11 = timestamp._8_8_;
  tVar13 = timestamp.tv_sec;
  iVar10 = timestamp.tv_usec;
  switch(timer) {
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = tVar13;
    (data->progress).t_startop.tv_usec = iVar10;
    break;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = tVar13;
    (data->progress).t_startsingle.tv_usec = iVar10;
    puVar1 = &(data->progress).field_0x18c;
    *puVar1 = *puVar1 & 0xfd;
    break;
  case TIMER_POSTQUEUE:
    uVar3 = (data->progress).t_startop.tv_sec;
    uVar4 = (data->progress).t_startop.tv_usec;
    older.tv_usec = uVar4;
    older.tv_sec = uVar3;
    newer._8_8_ = uVar11 & 0xffffffff;
    older._12_4_ = 0;
    newer.tv_sec = tVar13;
    tVar9 = Curl_timediff_us(newer,older);
    (data->progress).t_postqueue = tVar9;
    break;
  case TIMER_NAMELOOKUP:
    ptVar14 = &(data->progress).t_nslookup;
    goto LAB_006733dc;
  case TIMER_CONNECT:
    ptVar14 = &(data->progress).t_connect;
    goto LAB_006733dc;
  case TIMER_APPCONNECT:
    ptVar14 = &(data->progress).t_appconnect;
    goto LAB_006733dc;
  case TIMER_PRETRANSFER:
    ptVar14 = &(data->progress).t_pretransfer;
    goto LAB_006733dc;
  case TIMER_STARTTRANSFER:
    bVar2 = (data->progress).field_0x18c;
    if ((bVar2 & 2) != 0) {
      return;
    }
    ptVar14 = &(data->progress).t_starttransfer;
    (data->progress).field_0x18c = bVar2 | 2;
LAB_006733dc:
    uVar5 = (data->progress).t_startsingle.tv_sec;
    uVar6 = (data->progress).t_startsingle.tv_usec;
    older_00.tv_usec = uVar6;
    older_00.tv_sec = uVar5;
    newer_00._8_8_ = uVar11 & 0xffffffff;
    older_00._12_4_ = 0;
    newer_00.tv_sec = tVar13;
    tVar9 = Curl_timediff_us(newer_00,older_00);
    lVar12 = 1;
    if (1 < tVar9) {
      lVar12 = tVar9;
    }
    *ptVar14 = *ptVar14 + lVar12;
    break;
  case TIMER_STARTACCEPT:
    (data->progress).t_acceptdata.tv_sec = tVar13;
    (data->progress).t_acceptdata.tv_usec = iVar10;
    break;
  case TIMER_REDIRECT:
    uVar7 = (data->progress).start.tv_sec;
    uVar8 = (data->progress).start.tv_usec;
    older_01.tv_usec = uVar8;
    older_01.tv_sec = uVar7;
    newer_01._8_8_ = uVar11 & 0xffffffff;
    older_01._12_4_ = 0;
    newer_01.tv_sec = tVar13;
    tVar9 = Curl_timediff_us(newer_01,older_01);
    (data->progress).t_redirect = tVar9;
  }
  return;
}

Assistant:

void Curl_pgrsTimeWas(struct Curl_easy *data, timerid timer,
                      struct curltime timestamp)
{
  timediff_t *delta = NULL;

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = timestamp;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single transfer */
    data->progress.t_startsingle = timestamp;
    data->progress.is_t_startransfer_set = false;
    break;
  case TIMER_POSTQUEUE:
    /* Set when the transfer starts (after potentially having been brought
       back from the waiting queue). It needs to count from t_startop and not
       t_startsingle since the latter is reset when a connection is brought
       back from the pending queue. */
    data->progress.t_postqueue =
      Curl_timediff_us(timestamp, data->progress.t_startop);
    break;
  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = timestamp;
    break;
  case TIMER_NAMELOOKUP:
    delta = &data->progress.t_nslookup;
    break;
  case TIMER_CONNECT:
    delta = &data->progress.t_connect;
    break;
  case TIMER_APPCONNECT:
    delta = &data->progress.t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    delta = &data->progress.t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    delta = &data->progress.t_starttransfer;
    /* prevent updating t_starttransfer unless:
     *   1) this is the first time we're setting t_starttransfer
     *   2) a redirect has occurred since the last time t_starttransfer was set
     * This prevents repeated invocations of the function from incorrectly
     * changing the t_starttransfer time.
     */
    if(data->progress.is_t_startransfer_set) {
      return;
    }
    else {
      data->progress.is_t_startransfer_set = true;
      break;
    }
  case TIMER_POSTRANSFER:
    /* this is the normal end-of-transfer thing */
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_timediff_us(timestamp,
                                                 data->progress.start);
    break;
  }
  if(delta) {
    timediff_t us = Curl_timediff_us(timestamp, data->progress.t_startsingle);
    if(us < 1)
      us = 1; /* make sure at least one microsecond passed */
    *delta += us;
  }
}